

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::BranchInstr::IsLoopTail(BranchInstr *this,Func *func)

{
  code *pcVar1;
  BranchInstr **this_00;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  LabelInstr *pLVar5;
  Type_conflict node;
  Type *ppBVar6;
  BranchInstr **ref;
  Iterator __iter;
  Type pBStack_40;
  uint32 lastBranchNum;
  BranchInstr *lastBranchInstr;
  LabelInstr *target;
  Func *func_local;
  BranchInstr *this_local;
  
  if ((*(uint *)&func->field_0x240 >> 0x15 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x7e9,"(func->isPostLower)","func->isPostLower");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pLVar5 = GetTarget(this);
  if ((pLVar5->field_0x78 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    pBStack_40 = (Type)0x0;
    __iter.current._4_4_ = 0;
    _ref = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                     ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                      &pLVar5->labelRefs);
    while( true ) {
      if (__iter.list == (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      this_00 = ref;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)this_00,
                         node);
      if (bVar2) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppBVar6 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&ref);
      uVar3 = Instr::GetNumber(&(*ppBVar6)->super_Instr);
      if (__iter.current._4_4_ < uVar3) {
        pBStack_40 = *ppBVar6;
        __iter.current._4_4_ = Instr::GetNumber(&pBStack_40->super_Instr);
      }
    }
    if (this == pBStack_40) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
BranchInstr::IsLoopTail(Func * func)
{
    Assert(func->isPostLower);
    IR::LabelInstr * target = this->GetTarget();
    if (!target->m_isLoopTop)
    {
        return false;
    }

    IR::BranchInstr * lastBranchInstr = nullptr;
    uint32 lastBranchNum = 0;
    FOREACH_SLISTCOUNTED_ENTRY(IR::BranchInstr *, ref, &target->labelRefs)
    {
        if (ref->GetNumber() > lastBranchNum)
        {
            lastBranchInstr = ref;
            lastBranchNum = lastBranchInstr->GetNumber();
        }
    }
    NEXT_SLISTCOUNTED_ENTRY;

    if (this == lastBranchInstr)
    {
        return true;
    }
    return false;
}